

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DTDScanner::scanSystemLiteral(DTDScanner *this,XMLBuffer *toFill)

{
  XMLSize_t XVar1;
  bool bVar2;
  XMLCh XVar3;
  undefined8 in_RAX;
  UnexpectedEOFException *this_00;
  XMLCh quoteCh;
  undefined8 uStack_28;
  
  toFill->fIndex = 0;
  uStack_28 = in_RAX;
  bVar2 = ReaderMgr::skipIfQuote(this->fReaderMgr,(XMLCh *)((long)&uStack_28 + 6));
  if (bVar2) {
    XVar3 = ReaderMgr::getNextChar(this->fReaderMgr);
    if (XVar3 != uStack_28._6_2_) {
      do {
        if (XVar3 == L'\0') {
          this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
          UnexpectedEOFException::UnexpectedEOFException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
                     ,0xebf,Gen_UnexpectedEOF,this->fMemoryManager);
          __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
        }
        if (toFill->fIndex == toFill->fCapacity) {
          XMLBuffer::ensureCapacity(toFill,1);
        }
        XVar1 = toFill->fIndex;
        toFill->fIndex = XVar1 + 1;
        toFill->fBuffer[XVar1] = XVar3;
        XVar3 = ReaderMgr::getNextChar(this->fReaderMgr);
      } while (XVar3 != uStack_28._6_2_);
    }
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedQuotedString);
  }
  return bVar2;
}

Assistant:

bool DTDScanner::scanSystemLiteral(XMLBuffer& toFill)
{
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh)) {
        fScanner->emitError(XMLErrs::ExpectedQuotedString);
        return false;
    }

	XMLCh nextCh;
    // Break out on terminating quote
    while ((nextCh=fReaderMgr->getNextChar())!=quoteCh)
    {
        // Watch for EOF
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        toFill.append(nextCh);
    }
    return true;
}